

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

void polyscope::error(string *message)

{
  ostream *poVar1;
  logic_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"[ERROR] ");
    poVar1 = std::operator<<(poVar1,(string *)message);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (options::errorsThrowExceptions != '\x01') {
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 options::printPrefix_abi_cxx11_,message);
  std::logic_error::logic_error(this,(string *)&bStack_38);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void error(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "[ERROR] " << message << std::endl;
  }

  if (options::errorsThrowExceptions) {
    throw std::logic_error(options::printPrefix + message);
  }
}